

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::detail::MultipartFormDataParser::parse
          (MultipartFormDataParser *this,char *buf,size_t n,ContentReceiver *content_callback,
          MultipartContentHeader *header_callback)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  MultipartFormDataParser *pMVar5;
  allocator<char> *paVar6;
  long lVar7;
  function<bool_(const_char_*,_unsigned_long)> *this_00;
  MultipartFormDataParser *pMVar8;
  MultipartFormData *pMVar9;
  string *in_RCX;
  MultipartFormDataParser *in_RDI;
  unsigned_long len;
  size_t pos_1;
  smatch m;
  string header;
  size_t pos;
  MultipartFormData *in_stack_fffffffffffffe38;
  MultipartFormDataParser *in_stack_fffffffffffffe40;
  MultipartFormDataParser *in_stack_fffffffffffffe48;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffe50;
  MultipartFormDataParser *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  MultipartFormDataParser *in_stack_fffffffffffffe68;
  allocator<char> *in_stack_fffffffffffffe70;
  MultipartFormDataParser *in_stack_fffffffffffffe78;
  MultipartFormDataParser *in_stack_fffffffffffffe80;
  string local_110 [32];
  string local_f0 [64];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [39];
  allocator<char> local_49;
  MultipartFormDataParser *local_48;
  string *local_28;
  
  local_28 = in_RCX;
  if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                   ::re_content_disposition_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffe80,
               (char *)in_stack_fffffffffffffe78,
               (flag_type)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                         ::re_content_disposition_abi_cxx11_);
  }
  buf_append(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
             (size_t)in_stack_fffffffffffffe70);
  do {
    sVar3 = buf_size(in_RDI);
    if (sVar3 == 0) {
      return true;
    }
    switch(in_RDI->state_) {
    case 0:
      sVar3 = buf_find(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      buf_erase(in_RDI,sVar3);
      uVar4 = std::__cxx11::string::size();
      sVar3 = buf_size(in_RDI);
      if (sVar3 < uVar4) {
        return true;
      }
      bVar1 = buf_start_with(in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->name);
      if (!bVar1) {
        return false;
      }
      sVar3 = std::__cxx11::string::size();
      buf_erase(in_RDI,sVar3);
      in_RDI->state_ = 1;
      break;
    case 1:
      clear_file_info(in_stack_fffffffffffffe40);
      in_RDI->state_ = 2;
      break;
    case 2:
      local_48 = (MultipartFormDataParser *)
                 buf_find(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      if ((MultipartFormDataParser *)0x2000 < local_48) {
        return false;
      }
      while (pMVar8 = local_48, pMVar5 = (MultipartFormDataParser *)buf_size(in_RDI),
            pMVar8 < pMVar5) {
        if (local_48 == (MultipartFormDataParser *)0x0) {
          bVar1 = std::function<bool_(const_httplib::MultipartFormData_&)>::operator()
                            ((function<bool_(const_httplib::MultipartFormData_&)> *)
                             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          if (!bVar1) {
            in_RDI->is_valid_ = false;
            return false;
          }
          sVar3 = std::__cxx11::string::size();
          buf_erase(in_RDI,sVar3);
          in_RDI->state_ = 3;
          break;
        }
        if ((parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
             ::header_name_abi_cxx11_ == '\0') &&
           (iVar2 = __cxa_guard_acquire(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                                         ::header_name_abi_cxx11_), iVar2 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (&in_stack_fffffffffffffe80->dash_,(char *)in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe70);
          std::allocator<char>::~allocator(&local_49);
          __cxa_atexit(std::__cxx11::string::~string,
                       &parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                        ::header_name_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&parse(char_const*,unsigned_long,std::function<bool(char_const*,unsigned_long)>const&,std::function<bool(httplib::MultipartFormData_const&)>const&)
                               ::header_name_abi_cxx11_);
        }
        buf_head_abi_cxx11_(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
        bVar1 = start_with_case_ignore
                          (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                           &in_stack_fffffffffffffe58->dash_);
        if (bVar1) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_b0,(ulong)local_70);
          trim_copy(&in_stack_fffffffffffffe68->dash_);
          std::__cxx11::string::operator=((string *)&(in_RDI->file_).content_type,local_90);
          std::__cxx11::string::~string(local_90);
          std::__cxx11::string::~string(local_b0);
        }
        else {
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)in_stack_fffffffffffffe40);
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (in_stack_fffffffffffffe60,
                             (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                             (match_flag_type)((ulong)in_stack_fffffffffffffe48 >> 0x20));
          if (bVar1) {
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
            std::__cxx11::sub_match::operator_cast_to_string
                      ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe38);
            std::__cxx11::string::operator=((string *)&in_RDI->file_,local_f0);
            std::__cxx11::string::~string(local_f0);
            std::__cxx11::
            match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
            std::__cxx11::sub_match::operator_cast_to_string
                      ((sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffe38);
            std::__cxx11::string::operator=((string *)&(in_RDI->file_).filename,local_110);
            std::__cxx11::string::~string(local_110);
          }
          std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)0x1dee10);
        }
        in_stack_fffffffffffffe80 = local_48;
        lVar7 = std::__cxx11::string::size();
        buf_erase(in_RDI,(size_t)(&(in_stack_fffffffffffffe80->dash_)._M_dataplus + lVar7));
        in_stack_fffffffffffffe78 =
             (MultipartFormDataParser *)
             buf_find(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        local_48 = in_stack_fffffffffffffe78;
        std::__cxx11::string::~string(local_70);
      }
      if (in_RDI->state_ != 3) {
        return true;
      }
      break;
    case 3:
      in_stack_fffffffffffffe70 = (allocator<char> *)std::__cxx11::string::size();
      paVar6 = (allocator<char> *)buf_size(in_RDI);
      if (paVar6 < in_stack_fffffffffffffe70) {
        return true;
      }
      in_stack_fffffffffffffe58 =
           (MultipartFormDataParser *)buf_find(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe68 = in_stack_fffffffffffffe58;
      pMVar8 = (MultipartFormDataParser *)buf_size(in_RDI);
      if (pMVar8 <= in_stack_fffffffffffffe68) {
        this_00 = (function<bool_(const_char_*,_unsigned_long)> *)buf_size(in_RDI);
        lVar7 = std::__cxx11::string::size();
        sVar3 = (long)this_00 - lVar7;
        if (sVar3 != 0) {
          buf_data((MultipartFormDataParser *)0x1df03a);
          bVar1 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                            (this_00,(char *)local_28,(unsigned_long)in_stack_fffffffffffffe40);
          if (!bVar1) {
            in_RDI->is_valid_ = false;
            return false;
          }
          buf_erase(in_RDI,sVar3);
        }
        return true;
      }
      in_stack_fffffffffffffe60 = local_28;
      buf_data((MultipartFormDataParser *)0x1def59);
      bVar1 = std::function<bool_(const_char_*,_unsigned_long)>::operator()
                        ((function<bool_(const_char_*,_unsigned_long)> *)in_stack_fffffffffffffe50,
                         (char *)in_stack_fffffffffffffe48,(unsigned_long)in_stack_fffffffffffffe40)
      ;
      if (!bVar1) {
        in_RDI->is_valid_ = false;
        return false;
      }
      lVar7 = std::__cxx11::string::size();
      buf_erase(in_RDI,(size_t)(&(in_stack_fffffffffffffe58->dash_)._M_dataplus + lVar7));
      in_RDI->state_ = 4;
      break;
    case 4:
      in_stack_fffffffffffffe40 = (MultipartFormDataParser *)std::__cxx11::string::size();
      pMVar8 = (MultipartFormDataParser *)buf_size(in_RDI);
      if (pMVar8 < in_stack_fffffffffffffe40) {
        return true;
      }
      bVar1 = buf_start_with(in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->name);
      if (bVar1) {
        sVar3 = std::__cxx11::string::size();
        buf_erase(in_RDI,sVar3);
        in_RDI->state_ = 1;
      }
      else {
        in_stack_fffffffffffffe38 = (MultipartFormData *)std::__cxx11::string::size();
        pMVar9 = (MultipartFormData *)buf_size(in_RDI);
        if (pMVar9 < in_stack_fffffffffffffe38) {
          return true;
        }
        bVar1 = buf_start_with(in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->name);
        if (!bVar1) {
          return true;
        }
        sVar3 = std::__cxx11::string::size();
        buf_erase(in_RDI,sVar3);
        in_RDI->is_valid_ = true;
        sVar3 = buf_size(in_RDI);
        buf_erase(in_RDI,sVar3);
      }
    }
  } while( true );
}

Assistant:

bool parse(const char* buf, size_t n, const ContentReceiver& content_callback,
                const MultipartContentHeader& header_callback) {

                // TODO: support 'filename*'
                static const std::regex re_content_disposition(
                    R"~(^Content-Disposition:\s*form-data;\s*name="(.*?)"(?:;\s*filename="(.*?)")?(?:;\s*filename\*=\S+)?\s*$)~",
                    std::regex_constants::icase);

                buf_append(buf, n);

                while (buf_size() > 0) {
                    switch (state_) {
                        case 0:
                        { // Initial boundary
                            buf_erase(buf_find(dash_boundary_crlf_));
                            if (dash_boundary_crlf_.size() > buf_size()) { return true; }
                            if (!buf_start_with(dash_boundary_crlf_)) { return false; }
                            buf_erase(dash_boundary_crlf_.size());
                            state_ = 1;
                            break;
                        }
                        case 1:
                        { // New entry
                            clear_file_info();
                            state_ = 2;
                            break;
                        }
                        case 2:
                        { // Headers
                            auto pos = buf_find(crlf_);
                            if (pos > CPPHTTPLIB_HEADER_MAX_LENGTH) { return false; }
                            while (pos < buf_size()) {
                                // Empty line
                                if (pos == 0) {
                                    if (!header_callback(file_)) {
                                        is_valid_ = false;
                                        return false;
                                    }
                                    buf_erase(crlf_.size());
                                    state_ = 3;
                                    break;
                                }

                                static const std::string header_name = "content-type:";
                                const auto header = buf_head(pos);
                                if (start_with_case_ignore(header, header_name)) {
                                    file_.content_type = trim_copy(header.substr(header_name.size()));
                                } else {
                                    std::smatch m;
                                    if (std::regex_match(header, m, re_content_disposition)) {
                                        file_.name = m[1];
                                        file_.filename = m[2];
                                    }
                                }
                                buf_erase(pos + crlf_.size());
                                pos = buf_find(crlf_);
                            }
                            if (state_ != 3) { return true; }
                            break;
                        }
                        case 3:
                        { // Body
                            if (crlf_dash_boundary_.size() > buf_size()) { return true; }
                            auto pos = buf_find(crlf_dash_boundary_);
                            if (pos < buf_size()) {
                                if (!content_callback(buf_data(), pos)) {
                                    is_valid_ = false;
                                    return false;
                                }
                                buf_erase(pos + crlf_dash_boundary_.size());
                                state_ = 4;
                            } else {
                                auto len = buf_size() - crlf_dash_boundary_.size();
                                if (len > 0) {
                                    if (!content_callback(buf_data(), len)) {
                                        is_valid_ = false;
                                        return false;
                                    }
                                    buf_erase(len);
                                }
                                return true;
                            }
                            break;
                        }
                        case 4:
                        { // Boundary
                            if (crlf_.size() > buf_size()) { return true; }
                            if (buf_start_with(crlf_)) {
                                buf_erase(crlf_.size());
                                state_ = 1;
                            } else {
                                if (dash_crlf_.size() > buf_size()) { return true; }
                                if (buf_start_with(dash_crlf_)) {
                                    buf_erase(dash_crlf_.size());
                                    is_valid_ = true;
                                    buf_erase(buf_size()); // Remove epilogue
                                } else {
                                    return true;
                                }
                            }
                            break;
                        }
                    }
                }

                return true;
            }